

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.cpp
# Opt level: O0

ScalarFunction * duckdb::AliasFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  vector<duckdb::LogicalType,_true> *unaff_retaddr;
  ScalarFunction *in_stack_00000008;
  function_statistics_t in_stack_00000040;
  init_local_state_t in_stack_00000048;
  LogicalType *in_stack_00000050;
  FunctionStability in_stack_00000058;
  FunctionNullHandling in_stack_00000060;
  bind_lambda_function_t in_stack_00000068;
  ScalarFunction *fun;
  allocator_type *in_stack_fffffffffffffeb8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffec0;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  LogicalTypeId in_stack_fffffffffffffedf;
  LogicalType *in_stack_fffffffffffffee0;
  undefined8 **local_d8;
  undefined8 *local_50 [3];
  undefined1 **local_38;
  undefined8 local_30;
  bind_scalar_function_extended_t in_stack_ffffffffffffffe0;
  bind_scalar_function_t in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  ScalarFunction *return_type;
  
  uVar2 = 0;
  return_type = in_RDI;
  LogicalType::LogicalType(in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
  local_38 = (undefined1 **)local_50;
  local_30 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2001584);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffed0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffec8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffed4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffec0,iVar1,in_stack_fffffffffffffeb8);
  LogicalType::LogicalType(in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  LogicalType::LogicalType(in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
  ScalarFunction::ScalarFunction
            (in_stack_00000008,unaff_retaddr,(LogicalType *)return_type,
             (scalar_function_t *)CONCAT17(uVar2,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_00000040,in_stack_00000048
             ,in_stack_00000050,in_stack_00000058,in_stack_00000060,in_stack_00000068);
  LogicalType::~LogicalType((LogicalType *)0x2001651);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x200165e);
  LogicalType::~LogicalType((LogicalType *)0x200166b);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2001678);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2001685);
  local_d8 = &local_38;
  do {
    local_d8 = local_d8 + -3;
    LogicalType::~LogicalType((LogicalType *)0x20016ae);
  } while (local_d8 != local_50);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return in_RDI;
}

Assistant:

ScalarFunction AliasFun::GetFunction() {
	auto fun = ScalarFunction({LogicalType::ANY}, LogicalType::VARCHAR, AliasFunction);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}